

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::AddLinkObject(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer ppVar1;
  string *psVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar3;
  cmListFileBacktrace local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_78;
  reference local_48;
  LinkEntry *entry;
  _Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_> _Stack_38;
  int index;
  undefined1 local_30;
  _Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_> local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> lei;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  
  lei._8_8_ = item;
  pVar3 = AllocateLinkEntry(this,item);
  _Stack_38 = pVar3.first._M_node;
  local_30 = pVar3.second;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_28._M_node = _Stack_38._M_node;
    lei.first._M_node._0_1_ = local_30;
    ppVar1 = std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>::operator->(&local_28);
    entry._4_4_ = ppVar1->second;
    local_48 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(long)entry._4_4_);
    psVar2 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)lei._8_8_);
    std::__cxx11::string::string((string *)&local_98,(string *)psVar2);
    cmListFileBacktrace::cmListFileBacktrace(&local_a8,(cmListFileBacktrace *)(lei._8_8_ + 0x30));
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_78,&local_98,&local_a8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              (&local_48->Item,&local_78);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_78);
    cmListFileBacktrace::~cmListFileBacktrace(&local_a8);
    std::__cxx11::string::~string((string *)&local_98);
    local_48->Kind = Object;
    std::vector<int,std::allocator<int>>::emplace_back<int&>
              ((vector<int,std::allocator<int>> *)&this->ObjectEntries,(int *)((long)&entry + 4));
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkObject(cmLinkItem const& item)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    return;
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Kind = LinkEntry::Object;

  // Record explicitly linked object files separately.
  this->ObjectEntries.emplace_back(index);
}